

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_ecdsa_adaptor.cpp
# Opt level: O2

ByteData *
cfd::core::AdaptorUtil::Adapt
          (ByteData *__return_storage_ptr__,AdaptorSignature *adaptor_signature,Privkey *sk)

{
  pointer adaptor_secret32;
  int iVar1;
  secp256k1_context_struct *ctx;
  CfdException *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> signature;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_b8;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  secp256k1_ecdsa_signature secp_signature;
  
  ctx = wally_get_secp_context();
  Privkey::GetData((ByteData *)&local_b8,sk);
  ByteData::GetBytes(&signature,(ByteData *)&local_b8);
  adaptor_secret32 =
       signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start;
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)adaptor_signature);
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_88,
                     (ByteData *)&local_a0);
  iVar1 = secp256k1_ecdsa_adaptor_adapt
                    (ctx,&secp_signature,adaptor_secret32,
                     local_88._M_impl.super__Vector_impl_data._M_start);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_88);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_a0);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_b8);
  if (iVar1 == 1) {
    ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&signature,0x40,
               (allocator_type *)&local_b8);
    secp256k1_ecdsa_signature_serialize_compact
              (ctx,signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,&secp_signature);
    ByteData::ByteData(__return_storage_ptr__,&signature);
    ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              (&signature.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
    return __return_storage_ptr__;
  }
  this = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&signature,"Could not adapt signature.",(allocator *)&local_b8);
  CfdException::CfdException(this,kCfdInternalError,(string *)&signature);
  __cxa_throw(this,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

ByteData AdaptorUtil::Adapt(
    const AdaptorSignature &adaptor_signature, const Privkey &sk) {
  auto ctx = wally_get_secp_context();
  secp256k1_ecdsa_signature secp_signature;
  auto ret = secp256k1_ecdsa_adaptor_adapt(
      ctx, &secp_signature, sk.GetData().GetBytes().data(),
      adaptor_signature.GetData().GetBytes().data());

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not adapt signature.");
  }

  std::vector<uint8_t> signature(64);
  secp256k1_ecdsa_signature_serialize_compact(
      ctx, signature.data(), &secp_signature);

  if (ret != 1) {
    throw CfdException(
        CfdError::kCfdInternalError, "Could not serialize signature.");
  }

  return ByteData(signature);
}